

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-ldst.inc.c
# Opt level: O0

int tcg_out_ldst_finalize(TCGContext_conflict9 *s)

{
  bool bVar1;
  TCGLabelQemuLdst_conflict *local_20;
  TCGLabelQemuLdst_conflict *lb;
  TCGContext_conflict9 *s_local;
  
  local_20 = (TCGLabelQemuLdst_conflict *)(s->ldst_labels).sqh_first;
  while( true ) {
    if (local_20 == (TCGLabelQemuLdst_conflict *)0x0) {
      return 0;
    }
    if ((local_20->is_ld & 1U) == 0) {
      bVar1 = tcg_out_qemu_st_slow_path(s,local_20);
    }
    else {
      bVar1 = tcg_out_qemu_ld_slow_path(s,local_20);
    }
    if (!bVar1) break;
    if (s->code_gen_highwater < s->code_ptr) {
      return -1;
    }
    local_20 = (local_20->next).sqe_next;
  }
  return -2;
}

Assistant:

static int tcg_out_ldst_finalize(TCGContext *s)
{
    TCGLabelQemuLdst *lb;

    /* qemu_ld/st slow paths */
    QSIMPLEQ_FOREACH(lb, &s->ldst_labels, next) {
        if (lb->is_ld
            ? !tcg_out_qemu_ld_slow_path(s, lb)
            : !tcg_out_qemu_st_slow_path(s, lb)) {
            return -2;
        }

        /* Test for (pending) buffer overflow.  The assumption is that any
           one operation beginning below the high water mark cannot overrun
           the buffer completely.  Thus we can test for overflow after
           generating code without having to check during generation.  */
        if (unlikely((void *)s->code_ptr > s->code_gen_highwater)) {
            return -1;
        }
    }
    return 0;
}